

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::M68k::Primitive::bitwise<(InstructionSet::M68k::Operation)112,unsigned_int>
               (uint source,uint *destination,Status *status)

{
  Status *status_local;
  uint *destination_local;
  uint source_local;
  
  *destination = source ^ *destination;
  status->carry_flag = 0;
  status->overflow_flag = 0;
  Status::set_neg_zero<unsigned_int>(status,*destination);
  return;
}

Assistant:

void bitwise(IntT source, IntT &destination, Status &status) {
	static_assert(
		operation == Operation::ANDb ||	operation == Operation::ANDw || operation == Operation::ANDl ||
		operation == Operation::ORb ||	operation == Operation::ORw || operation == Operation::ORl ||
		operation == Operation::EORb ||	operation == Operation::EORw || operation == Operation::EORl
	);

	switch(operation) {
		case Operation::ANDb:	case Operation::ANDw:	case Operation::ANDl:
			destination &= source;
		break;
		case Operation::ORb:	case Operation::ORw:	case Operation::ORl:
			destination |= source;
		break;
		case Operation::EORb:	case Operation::EORw:	case Operation::EORl:
			destination ^= source;
		break;
	}

	status.overflow_flag = status.carry_flag = 0;
	status.set_neg_zero(destination);
}